

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O3

int32_t readl_bfr(Btor2Parser *bfr)

{
  int64_t lineno;
  int32_t iVar1;
  int iVar2;
  long in_RAX;
  long lVar3;
  Btor2Line *l;
  char *pcVar4;
  Btor2Tag BVar5;
  int64_t id;
  long local_28;
  
  local_28 = in_RAX;
  do {
    while (iVar1 = getc_bfr(bfr), 0x1f < iVar1) {
      if (iVar1 != 0x20) {
        if (iVar1 != 0x3b) goto LAB_00101789;
        iVar1 = skip_comment(bfr);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  } while (iVar1 == 10);
  if (iVar1 == -1) {
    return 0;
  }
  if (iVar1 == 9) {
    pcVar4 = "unexpected tab character at start of line";
LAB_00101881:
    perr_bfr(bfr,pcVar4);
    return 0;
  }
LAB_00101789:
  bfr->saved = iVar1;
  iVar1 = parse_id_bfr(bfr,&local_28);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = getc_bfr(bfr);
  if (iVar1 != 0x20) {
    pcVar4 = "expected space after id";
    goto LAB_00101881;
  }
  if (local_28 < bfr->ntable) {
    lVar3 = -local_28;
    if (0 < local_28) {
      lVar3 = local_28;
    }
    if ((lVar3 < bfr->ntable && local_28 != 0) && (bfr->table[lVar3] != (Btor2Line *)0x0)) {
      pcVar4 = "id already defined";
    }
    else {
      pcVar4 = "id out-of-order";
    }
    goto LAB_00101881;
  }
  lineno = bfr->lineno;
  pcVar4 = parse_tag(bfr);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  switch(*pcVar4) {
  case 'a':
    iVar2 = strcmp(pcVar4,"add");
    if (iVar2 == 0) {
      pcVar4 = "add";
      BVar5 = BTOR2_TAG_add;
    }
    else {
      iVar2 = strcmp(pcVar4,"and");
      if (iVar2 != 0) goto switchD_0010182f_caseD_67;
      pcVar4 = "and";
      BVar5 = BTOR2_TAG_and;
    }
    break;
  case 'b':
    iVar2 = strcmp(pcVar4,"bad");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "bad";
    BVar5 = BTOR2_TAG_bad;
    goto LAB_001020e8;
  case 'c':
    iVar2 = strcmp(pcVar4,"constraint");
    if (iVar2 == 0) {
      pcVar4 = "constraint";
      BVar5 = BTOR2_TAG_constraint;
      goto LAB_001020e8;
    }
    iVar2 = strcmp(pcVar4,"concat");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"const");
      if (iVar2 == 0) {
        pcVar4 = "const";
        BVar5 = BTOR2_TAG_const;
      }
      else {
        iVar2 = strcmp(pcVar4,"constd");
        if (iVar2 == 0) {
          pcVar4 = "constd";
          BVar5 = BTOR2_TAG_constd;
        }
        else {
          iVar2 = strcmp(pcVar4,"consth");
          if (iVar2 != 0) goto switchD_0010182f_caseD_67;
          pcVar4 = "consth";
          BVar5 = BTOR2_TAG_consth;
        }
      }
      goto LAB_00102352;
    }
    pcVar4 = "concat";
    BVar5 = BTOR2_TAG_concat;
    break;
  case 'd':
    iVar2 = strcmp(pcVar4,"dec");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "dec";
    BVar5 = BTOR2_TAG_dec;
LAB_00102324:
    l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
    iVar2 = parse_unary_op_bfr(bfr,l);
    goto LAB_00102651;
  case 'e':
    if ((pcVar4[1] != 'q') || (pcVar4[2] != '\0')) goto switchD_0010182f_caseD_67;
    pcVar4 = "eq";
    BVar5 = BTOR2_TAG_eq;
    break;
  case 'f':
    iVar2 = strcmp(pcVar4,"fair");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "fair";
    BVar5 = BTOR2_TAG_fair;
LAB_001020e8:
    l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
    iVar2 = parse_constraint_bfr(bfr,l);
    goto LAB_00102651;
  default:
    goto switchD_0010182f_caseD_67;
  case 'i':
    iVar2 = strcmp(pcVar4,"implies");
    if (iVar2 == 0) {
      pcVar4 = "implies";
      BVar5 = BTOR2_TAG_implies;
    }
    else {
      iVar2 = strcmp(pcVar4,"iff");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar4,"inc");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar4,"init");
          if (iVar2 == 0) {
            l = new_line_bfr(bfr,local_28,lineno,"init",BTOR2_TAG_init);
            iVar2 = parse_init_bfr(bfr,l);
            goto LAB_00102651;
          }
          iVar2 = strcmp(pcVar4,"input");
          if (iVar2 == 0) {
            pcVar4 = "input";
            BVar5 = BTOR2_TAG_input;
LAB_00102448:
            l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
            iVar2 = parse_sort_id_bfr(bfr,&l->sort);
            goto LAB_00102651;
          }
          iVar2 = strcmp(pcVar4,"ite");
          if (iVar2 != 0) goto switchD_0010182f_caseD_67;
          pcVar4 = "ite";
          BVar5 = BTOR2_TAG_ite;
          goto LAB_00101eee;
        }
        pcVar4 = "inc";
        BVar5 = BTOR2_TAG_inc;
        goto LAB_00102324;
      }
      pcVar4 = "iff";
      BVar5 = BTOR2_TAG_iff;
    }
    break;
  case 'j':
    iVar2 = strcmp(pcVar4,"justice");
    if (iVar2 == 0) {
      l = new_line_bfr(bfr,local_28,lineno,"justice",BTOR2_TAG_justice);
      iVar2 = parse_justice_bfr(bfr,l);
      goto LAB_00102651;
    }
    goto switchD_0010182f_caseD_67;
  case 'm':
    iVar2 = strcmp(pcVar4,"mul");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "mul";
    BVar5 = BTOR2_TAG_mul;
    break;
  case 'n':
    iVar2 = strcmp(pcVar4,"nand");
    if (iVar2 == 0) {
      pcVar4 = "nand";
      BVar5 = BTOR2_TAG_nand;
    }
    else {
      iVar2 = strcmp(pcVar4,"neq");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar4,"neg");
        if (iVar2 == 0) {
          pcVar4 = "neg";
          BVar5 = BTOR2_TAG_neg;
        }
        else {
          iVar2 = strcmp(pcVar4,"next");
          if (iVar2 == 0) {
            l = new_line_bfr(bfr,local_28,lineno,"next",BTOR2_TAG_next);
            iVar2 = parse_next_bfr(bfr,l);
            goto LAB_00102651;
          }
          iVar2 = strcmp(pcVar4,"nor");
          if (iVar2 == 0) {
            pcVar4 = "nor";
            BVar5 = BTOR2_TAG_nor;
            break;
          }
          iVar2 = strcmp(pcVar4,"not");
          if (iVar2 != 0) goto switchD_0010182f_caseD_67;
          pcVar4 = "not";
          BVar5 = BTOR2_TAG_not;
        }
        goto LAB_00102324;
      }
      pcVar4 = "neq";
      BVar5 = BTOR2_TAG_neq;
    }
    break;
  case 'o':
    iVar2 = strcmp(pcVar4,"one");
    if (iVar2 == 0) {
      pcVar4 = "one";
      BVar5 = BTOR2_TAG_one;
    }
    else {
      iVar2 = strcmp(pcVar4,"ones");
      if (iVar2 != 0) {
        if ((pcVar4[1] != 'r') || (pcVar4[2] != '\0')) {
          iVar2 = strcmp(pcVar4,"output");
          if (iVar2 != 0) goto switchD_0010182f_caseD_67;
          pcVar4 = "output";
          BVar5 = BTOR2_TAG_output;
          goto LAB_001020e8;
        }
        pcVar4 = "or";
        BVar5 = BTOR2_TAG_or;
        break;
      }
      pcVar4 = "ones";
      BVar5 = BTOR2_TAG_ones;
    }
    goto LAB_00102352;
  case 'r':
    iVar2 = strcmp(pcVar4,"read");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"redand");
      if (iVar2 == 0) {
        pcVar4 = "redand";
        BVar5 = BTOR2_TAG_redand;
      }
      else {
        iVar2 = strcmp(pcVar4,"redor");
        if (iVar2 == 0) {
          pcVar4 = "redor";
          BVar5 = BTOR2_TAG_redor;
        }
        else {
          iVar2 = strcmp(pcVar4,"redxor");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar4,"rol");
            if (iVar2 == 0) {
              pcVar4 = "rol";
              BVar5 = BTOR2_TAG_rol;
            }
            else {
              iVar2 = strcmp(pcVar4,"ror");
              if (iVar2 != 0) goto switchD_0010182f_caseD_67;
              pcVar4 = "ror";
              BVar5 = BTOR2_TAG_ror;
            }
            break;
          }
          pcVar4 = "redxor";
          BVar5 = BTOR2_TAG_redxor;
        }
      }
      goto LAB_00102324;
    }
    pcVar4 = "read";
    BVar5 = BTOR2_TAG_read;
    break;
  case 's':
    iVar2 = strcmp(pcVar4,"saddo");
    if (iVar2 == 0) {
      pcVar4 = "saddo";
      BVar5 = BTOR2_TAG_saddo;
    }
    else {
      iVar2 = strcmp(pcVar4,"sext");
      if (iVar2 == 0) {
        pcVar4 = "sext";
        BVar5 = BTOR2_TAG_sext;
LAB_0010223f:
        l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
        iVar2 = parse_ext_bfr(bfr,l);
        goto LAB_00102651;
      }
      iVar2 = strcmp(pcVar4,"sgt");
      if (iVar2 == 0) {
        pcVar4 = "sgt";
        BVar5 = BTOR2_TAG_sgt;
      }
      else {
        iVar2 = strcmp(pcVar4,"sgte");
        if (iVar2 == 0) {
          pcVar4 = "sgte";
          BVar5 = BTOR2_TAG_sgte;
        }
        else {
          iVar2 = strcmp(pcVar4,"sdiv");
          if (iVar2 == 0) {
            pcVar4 = "sdiv";
            BVar5 = BTOR2_TAG_sdiv;
          }
          else {
            iVar2 = strcmp(pcVar4,"sdivo");
            if (iVar2 == 0) {
              pcVar4 = "sdivo";
              BVar5 = BTOR2_TAG_sdivo;
            }
            else {
              iVar2 = strcmp(pcVar4,"slice");
              if (iVar2 == 0) {
                l = new_line_bfr(bfr,local_28,lineno,"slice",BTOR2_TAG_slice);
                iVar2 = parse_slice_bfr(bfr,l);
                goto LAB_00102651;
              }
              iVar2 = strcmp(pcVar4,"sll");
              if (iVar2 == 0) {
                pcVar4 = "sll";
                BVar5 = BTOR2_TAG_sll;
              }
              else {
                iVar2 = strcmp(pcVar4,"slt");
                if (iVar2 == 0) {
                  pcVar4 = "slt";
                  BVar5 = BTOR2_TAG_slt;
                }
                else {
                  iVar2 = strcmp(pcVar4,"slte");
                  if (iVar2 == 0) {
                    pcVar4 = "slte";
                    BVar5 = BTOR2_TAG_slte;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"sort");
                    if (iVar2 == 0) {
                      l = new_line_bfr(bfr,local_28,lineno,"sort",BTOR2_TAG_sort);
                      iVar2 = parse_sort_bfr(bfr,l);
                      goto LAB_00102651;
                    }
                    iVar2 = strcmp(pcVar4,"smod");
                    if (iVar2 == 0) {
                      pcVar4 = "smod";
                      BVar5 = BTOR2_TAG_smod;
                    }
                    else {
                      iVar2 = strcmp(pcVar4,"smulo");
                      if (iVar2 == 0) {
                        pcVar4 = "smulo";
                        BVar5 = BTOR2_TAG_smulo;
                      }
                      else {
                        iVar2 = strcmp(pcVar4,"ssubo");
                        if (iVar2 == 0) {
                          pcVar4 = "ssubo";
                          BVar5 = BTOR2_TAG_ssubo;
                        }
                        else {
                          iVar2 = strcmp(pcVar4,"sra");
                          if (iVar2 == 0) {
                            pcVar4 = "sra";
                            BVar5 = BTOR2_TAG_sra;
                          }
                          else {
                            iVar2 = strcmp(pcVar4,"srl");
                            if (iVar2 == 0) {
                              pcVar4 = "srl";
                              BVar5 = BTOR2_TAG_srl;
                            }
                            else {
                              iVar2 = strcmp(pcVar4,"srem");
                              if (iVar2 == 0) {
                                pcVar4 = "srem";
                                BVar5 = BTOR2_TAG_srem;
                              }
                              else {
                                iVar2 = strcmp(pcVar4,"state");
                                if (iVar2 == 0) {
                                  pcVar4 = "state";
                                  BVar5 = BTOR2_TAG_state;
                                  goto LAB_00102448;
                                }
                                iVar2 = strcmp(pcVar4,"sub");
                                if (iVar2 != 0) goto switchD_0010182f_caseD_67;
                                pcVar4 = "sub";
                                BVar5 = BTOR2_TAG_sub;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 'u':
    iVar2 = strcmp(pcVar4,"uaddo");
    if (iVar2 == 0) {
      pcVar4 = "uaddo";
      BVar5 = BTOR2_TAG_uaddo;
    }
    else {
      iVar2 = strcmp(pcVar4,"udiv");
      if (iVar2 == 0) {
        pcVar4 = "udiv";
        BVar5 = BTOR2_TAG_udiv;
      }
      else {
        iVar2 = strcmp(pcVar4,"uext");
        if (iVar2 == 0) {
          pcVar4 = "uext";
          BVar5 = BTOR2_TAG_uext;
          goto LAB_0010223f;
        }
        iVar2 = strcmp(pcVar4,"ugt");
        if (iVar2 == 0) {
          pcVar4 = "ugt";
          BVar5 = BTOR2_TAG_ugt;
        }
        else {
          iVar2 = strcmp(pcVar4,"ugte");
          if (iVar2 == 0) {
            pcVar4 = "ugte";
            BVar5 = BTOR2_TAG_ugte;
          }
          else {
            iVar2 = strcmp(pcVar4,"ult");
            if (iVar2 == 0) {
              pcVar4 = "ult";
              BVar5 = BTOR2_TAG_ult;
            }
            else {
              iVar2 = strcmp(pcVar4,"ulte");
              if (iVar2 == 0) {
                pcVar4 = "ulte";
                BVar5 = BTOR2_TAG_ulte;
              }
              else {
                iVar2 = strcmp(pcVar4,"umulo");
                if (iVar2 == 0) {
                  pcVar4 = "umulo";
                  BVar5 = BTOR2_TAG_umulo;
                }
                else {
                  iVar2 = strcmp(pcVar4,"urem");
                  if (iVar2 == 0) {
                    pcVar4 = "urem";
                    BVar5 = BTOR2_TAG_urem;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"usubo");
                    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
                    pcVar4 = "usubo";
                    BVar5 = BTOR2_TAG_usubo;
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 'w':
    iVar2 = strcmp(pcVar4,"write");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "write";
    BVar5 = BTOR2_TAG_write;
LAB_00101eee:
    l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
    iVar2 = parse_ternary_op_bfr(bfr,l);
    goto LAB_00102651;
  case 'x':
    iVar2 = strcmp(pcVar4,"xnor");
    if (iVar2 == 0) {
      pcVar4 = "xnor";
      BVar5 = BTOR2_TAG_xnor;
    }
    else {
      iVar2 = strcmp(pcVar4,"xor");
      if (iVar2 != 0) goto switchD_0010182f_caseD_67;
      pcVar4 = "xor";
      BVar5 = BTOR2_TAG_xor;
    }
    break;
  case 'z':
    iVar2 = strcmp(pcVar4,"zero");
    if (iVar2 != 0) goto switchD_0010182f_caseD_67;
    pcVar4 = "zero";
    BVar5 = BTOR2_TAG_zero;
LAB_00102352:
    l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
    iVar2 = parse_constant_bfr(bfr,l);
    goto LAB_00102651;
  }
  l = new_line_bfr(bfr,local_28,lineno,pcVar4,BVar5);
  iVar2 = parse_binary_op_bfr(bfr,l);
LAB_00102651:
  if (iVar2 == 0) {
    return 0;
  }
  pusht_bfr(bfr,l);
  iVar1 = check_sorts_bfr(bfr,l);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = parse_opt_symbol_bfr(bfr,l);
  return iVar1;
switchD_0010182f_caseD_67:
  perr_bfr(bfr,"invalid tag \'%s\'",pcVar4);
  return 0;
}

Assistant:

static int32_t
readl_bfr (Btor2Parser *bfr)
{
  const char *tag;
  int64_t lineno;
  int64_t id;
  int32_t ch;
START:
  // skip white spaces at the beginning of the line
  while ((ch = getc_bfr (bfr)) == ' ')
    ;
  if (ch == EOF) return 0;
  if (ch == '\n') goto START;
  if (ch == '\t')
    return perr_bfr (bfr, "unexpected tab character at start of line");
  if (ch == ';')
  {
    if (!skip_comment (bfr)) return 0;
    goto START;
  }
  ungetc_bfr (bfr, ch);
  if (!parse_id_bfr (bfr, &id)) return 0;
  if (getc_bfr (bfr) != ' ') return perr_bfr (bfr, "expected space after id");
  if (id < bfr->ntable)
  {
    if (id2line_bfr (bfr, id) != 0) return perr_bfr (bfr, "id already defined");
    return perr_bfr (bfr, "id out-of-order");
  }
  lineno = bfr->lineno;
  tag    = parse_tag (bfr);
  if (!tag) return 0;
  switch (tag[0])
  {
    case 'a':
      PARSE (add, binary_op);
      PARSE (and, binary_op);
      break;
    case 'b': PARSE (bad, constraint); break;
    case 'c':
      PARSE (constraint, constraint);
      PARSE (concat, binary_op);
      PARSE (const, constant);
      PARSE (constd, constant);
      PARSE (consth, constant);
      break;
    case 'd': PARSE (dec, unary_op); break;
    case 'e': PARSE (eq, binary_op); break;
    case 'f': PARSE (fair, constraint); break;
    case 'i':
      PARSE (implies, binary_op);
      PARSE (iff, binary_op);
      PARSE (inc, unary_op);
      PARSE (init, init);
      PARSE (input, input);
      PARSE (ite, ternary_op);
      break;
    case 'j': PARSE (justice, justice); break;
    case 'm': PARSE (mul, binary_op); break;
    case 'n':
      PARSE (nand, binary_op);
      PARSE (neq, binary_op);
      PARSE (neg, unary_op);
      PARSE (next, next);
      PARSE (nor, binary_op);
      PARSE (not, unary_op);
      break;
    case 'o':
      PARSE (one, constant);
      PARSE (ones, constant);
      PARSE (or, binary_op);
      PARSE (output, constraint);
      break;
    case 'r':
      PARSE (read, binary_op);
      PARSE (redand, unary_op);
      PARSE (redor, unary_op);
      PARSE (redxor, unary_op);
      PARSE (rol, binary_op);
      PARSE (ror, binary_op);
      break;
    case 's':
      PARSE (saddo, binary_op);
      PARSE (sext, ext);
      PARSE (sgt, binary_op);
      PARSE (sgte, binary_op);
      PARSE (sdiv, binary_op);
      PARSE (sdivo, binary_op);
      PARSE (slice, slice);
      PARSE (sll, binary_op);
      PARSE (slt, binary_op);
      PARSE (slte, binary_op);
      PARSE (sort, sort);
      PARSE (smod, binary_op);
      PARSE (smulo, binary_op);
      PARSE (ssubo, binary_op);
      PARSE (sra, binary_op);
      PARSE (srl, binary_op);
      PARSE (srem, binary_op);
      PARSE (state, input);
      PARSE (sub, binary_op);
      break;
    case 'u':
      PARSE (uaddo, binary_op);
      PARSE (udiv, binary_op);
      PARSE (uext, ext);
      PARSE (ugt, binary_op);
      PARSE (ugte, binary_op);
      PARSE (ult, binary_op);
      PARSE (ulte, binary_op);
      PARSE (umulo, binary_op);
      PARSE (urem, binary_op);
      PARSE (usubo, binary_op);
      break;
    case 'w': PARSE (write, ternary_op); break;
    case 'x':
      PARSE (xnor, binary_op);
      PARSE (xor, binary_op);
      break;
    case 'z': PARSE (zero, constant); break;
  }
  return perr_bfr (bfr, "invalid tag '%s'", tag);
}